

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O2

void __thiscall
QHttpNetworkRequest::setUploadByteDevice(QHttpNetworkRequest *this,QNonContiguousByteDevice *bd)

{
  QHttpNetworkRequestPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->(&this->d);
  pQVar1->uploadByteDevice = bd;
  return;
}

Assistant:

void QHttpNetworkRequest::setUploadByteDevice(QNonContiguousByteDevice *bd)
{
    d->uploadByteDevice = bd;
}